

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan.c
# Opt level: O1

parasail_result_t *
parasail_sw_rowcol_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  uint uVar1;
  int *piVar2;
  parasail_result_t *ppVar3;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int *__s;
  size_t size;
  int a;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  size_t size_00;
  int *local_58;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_rowcol_scan_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_rowcol_scan_cold_6();
  }
  else if (open < 0) {
    parasail_sw_rowcol_scan_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_rowcol_scan_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_rowcol_scan_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_rowcol_scan_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar4 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_sw_rowcol_scan_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar4 = (ulong)(uint)matrix->length;
    }
    a = (int)uVar4;
    ppVar3 = parasail_result_new_rowcol1(a,s2Len);
    if (ppVar3 != (parasail_result_t *)0x0) {
      ppVar3->flag = ppVar3->flag | 0x1440204;
      ptr = parasail_memalign_int(0x10,(ulong)(uint)s2Len);
      size_00 = (size_t)(a + 1);
      ptr_00 = parasail_memalign_int(0x10,size_00);
      size = (size_t)a;
      ptr_01 = parasail_memalign_int(0x10,size);
      ptr_02 = parasail_memalign_int(0x10,size_00);
      ptr_03 = parasail_memalign_int(0x10,size_00);
      if (ptr == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_00 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_01 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_02 != (int *)0x0) {
        if (ptr_03 == (int *)0x0) {
          return (parasail_result_t *)0x0;
        }
        if (matrix->type == 0) {
          local_58 = parasail_memalign_int(0x10,size);
          if (local_58 == (int *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < a) {
            piVar2 = matrix->mapper;
            uVar5 = 0;
            do {
              local_58[uVar5] = piVar2[(byte)_s1[uVar5]];
              uVar5 = uVar5 + 1;
            } while (uVar4 != uVar5);
          }
        }
        else {
          local_58 = (int *)0x0;
        }
        __s = ptr_00 + 1;
        piVar2 = matrix->mapper;
        uVar5 = 1;
        if (1 < s2Len) {
          uVar5 = (ulong)(uint)s2Len;
        }
        uVar7 = 0;
        do {
          ptr[uVar7] = piVar2[(byte)_s2[uVar7]];
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
        *ptr_00 = 0;
        *ptr_02 = 0;
        if (0 < a) {
          memset(__s,0,uVar4 * 4);
        }
        *ptr_03 = -0x40000000;
        if (0 < a) {
          uVar5 = 0;
          do {
            ptr_01[uVar5] = -0x40000000;
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
        }
        uVar1 = s2Len - 1;
        uVar5 = 1;
        if (1 < s2Len) {
          uVar5 = (ulong)(uint)s2Len;
        }
        iVar6 = -0x40000000;
        uVar8 = 0;
        uVar7 = uVar4;
        do {
          if (0 < a) {
            uVar9 = 0;
            do {
              iVar11 = __s[uVar9] - open;
              if (__s[uVar9] - open < ptr_01[uVar9] - gap) {
                iVar11 = ptr_01[uVar9] - gap;
              }
              ptr_01[uVar9] = iVar11;
              uVar9 = uVar9 + 1;
            } while (uVar4 != uVar9);
          }
          if (0 < a) {
            piVar2 = matrix->matrix;
            uVar9 = 0;
            do {
              if (matrix->type == 0) {
                iVar11 = local_58[uVar9] * matrix->size;
              }
              else {
                iVar11 = matrix->size * (int)uVar9;
              }
              iVar11 = ptr_00[uVar9] + piVar2[(long)iVar11 + (long)ptr[uVar8]];
              if (iVar11 <= ptr_01[uVar9]) {
                iVar11 = ptr_01[uVar9];
              }
              ptr_02[uVar9 + 1] = iVar11;
              uVar9 = uVar9 + 1;
            } while (uVar4 != uVar9);
          }
          if (0 < a) {
            iVar11 = *ptr_03;
            uVar9 = 0;
            do {
              iVar11 = iVar11 - gap;
              if (iVar11 <= ptr_02[uVar9]) {
                iVar11 = ptr_02[uVar9];
              }
              ptr_03[uVar9 + 1] = iVar11;
              uVar9 = uVar9 + 1;
            } while (uVar4 != uVar9);
          }
          if (0 < a) {
            uVar9 = 0;
            iVar11 = iVar6;
            do {
              iVar10 = ptr_03[uVar9 + 1] - open;
              if (ptr_03[uVar9 + 1] - open < ptr_02[uVar9 + 1]) {
                iVar10 = ptr_02[uVar9 + 1];
              }
              if (iVar10 < 1) {
                iVar10 = 0;
              }
              __s[uVar9] = iVar10;
              iVar6 = iVar11;
              if (iVar11 < iVar10) {
                uVar7 = uVar9 & 0xffffffff;
                iVar6 = iVar10;
              }
              if (iVar11 < iVar10) {
                s2Len = (int)uVar8;
              }
              uVar9 = uVar9 + 1;
              iVar11 = iVar6;
            } while (uVar4 != uVar9);
          }
          if (uVar8 == uVar1 && 0 < a) {
            uVar9 = 0;
            do {
              ((ppVar3->field_4).rowcols)->score_col[uVar9] = __s[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar4 != uVar9);
          }
          ((ppVar3->field_4).rowcols)->score_row[uVar8] = ptr_00[size];
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar5);
        ppVar3->score = iVar6;
        ppVar3->end_query = (int)uVar7;
        ppVar3->end_ref = s2Len;
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(local_58);
          return ppVar3;
        }
        return ppVar3;
      }
      return (parasail_result_t *)0x0;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H  = NULL;
    int * restrict E  = NULL;
    int * restrict HtB= NULL;
    int * restrict Ht = NULL;
    int * restrict FtB= NULL;
    int * restrict Ft = NULL;
    int s1Len = 0;
    int i = 0;
    int j = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    i = 0;
    j = 0;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    E  = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    FtB= parasail_memalign_int(16, s1Len+1);
    Ft = FtB+1;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!E) return NULL;
    if (!HtB) return NULL;
    if (!FtB) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }

    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H */
    H[-1] = 0;
    Ht[-1] = 0;
    for (i=0; i<s1Len; ++i) {
        H[i] = 0;
    }
    Ft[-1] = NEG_INF_32;

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
    }

    /* iterate over database */
    for (j=0; j<s2Len; ++j) {
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            E[i] = MAX(E[i]-gap, H[i]-open);
        }
        /* calculate Ht */
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            Ht[i] = MAX(H[i-1]+matval, E[i]);
        }
        /* calculate Ft */
        for (i=0; i<s1Len; ++i) {
            Ft[i] = MAX(Ft[i-1]-gap, Ht[i-1]);
        }
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            H[i] = MAX(Ht[i], Ft[i]-open);
            H[i] = MAX(H[i], 0);
#ifdef PARASAIL_TABLE
            result->tables->score_table[i*s2Len + j] = H[i];
#endif
            if (H[i] > score) {
                score = H[i];
                end_query = i;
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        if (j == s2Len-1) {
            for (i=0; i<s1Len; ++i) {
                result->rowcols->score_col[i] = H[i];
            }
        }
        result->rowcols->score_row[j] = H[s1Len-1];
#endif
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(FtB);
    parasail_free(HtB);
    parasail_free(E);
    parasail_free(HB);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}